

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::mergeRuleStatusVals(RBBITableBuilder *this)

{
  UVector *pUVar1;
  UVector *pUVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  void *pvVar6;
  int index;
  int index_00;
  int iVar7;
  int iVar8;
  
  pUVar1 = this->fRB->fRuleStatusVals;
  if (pUVar1->count == 0) {
    UVector::addElement(pUVar1,1,this->fStatus);
    UVector::addElement(this->fRB->fRuleStatusVals,0,this->fStatus);
  }
  index = 0;
  do {
    if (this->fDStates->count <= index) {
      return;
    }
    pvVar6 = UVector::elementAt(this->fDStates,index);
    pUVar1 = *(UVector **)((long)pvVar6 + 0x10);
    if (pUVar1 == (UVector *)0x0) {
      *(undefined4 *)((long)pvVar6 + 0x18) = 0;
    }
    else {
      *(undefined4 *)((long)pvVar6 + 0x18) = 0xffffffff;
      iVar8 = 0;
      do {
        do {
          index_00 = iVar8;
          pUVar2 = this->fRB->fRuleStatusVals;
          if (pUVar2->count <= index_00) {
            index_00 = *(int *)((long)pvVar6 + 0x18);
            goto LAB_00184549;
          }
          iVar3 = UVector::elementAti(pUVar2,index_00);
          iVar8 = index_00 + iVar3 + 1;
          iVar7 = pUVar1->count;
          iVar3 = UVector::elementAti(this->fRB->fRuleStatusVals,index_00);
        } while (iVar7 != iVar3);
        iVar7 = 0;
        while( true ) {
          iVar5 = pUVar1->count;
          if (iVar5 <= iVar7) break;
          iVar3 = UVector::elementAti(pUVar1,iVar7);
          iVar4 = UVector::elementAti(this->fRB->fRuleStatusVals,index_00 + iVar7 + 1);
          if (iVar3 != iVar4) {
            iVar5 = pUVar1->count;
            break;
          }
          iVar7 = iVar7 + 1;
        }
      } while (iVar5 != iVar7);
      *(int *)((long)pvVar6 + 0x18) = index_00;
LAB_00184549:
      if (index_00 == -1) {
        pUVar2 = this->fRB->fRuleStatusVals;
        *(int32_t *)((long)pvVar6 + 0x18) = pUVar2->count;
        UVector::addElement(pUVar2,pUVar1->count,this->fStatus);
        for (iVar8 = 0; iVar8 < pUVar1->count; iVar8 = iVar8 + 1) {
          pUVar2 = this->fRB->fRuleStatusVals;
          iVar3 = UVector::elementAti(pUVar1,iVar8);
          UVector::addElement(pUVar2,iVar3,this->fStatus);
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void  RBBITableBuilder::mergeRuleStatusVals() {
    //
    //  The basic outline of what happens here is this...
    //
    //    for each state in this state table
    //       if the status tag list for this state is in the global statuses list
    //           record where and
    //           continue with the next state
    //       else
    //           add the tag list for this state to the global list.
    //
    int i;
    int n;

    // Pre-set a single tag of {0} into the table.
    //   We will need this as a default, for rule sets with no explicit tagging.
    if (fRB->fRuleStatusVals->size() == 0) {
        fRB->fRuleStatusVals->addElement(1, *fStatus);  // Num of statuses in group
        fRB->fRuleStatusVals->addElement((int32_t)0, *fStatus);  //   and our single status of zero
    }

    //    For each state
    for (n=0; n<fDStates->size(); n++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
        UVector *thisStatesTagValues = sd->fTagVals;
        if (thisStatesTagValues == NULL) {
            // No tag values are explicitly associated with this state.
            //   Set the default tag value.
            sd->fTagsIdx = 0;
            continue;
        }

        // There are tag(s) associated with this state.
        //   fTagsIdx will be the index into the global tag list for this state's tag values.
        //   Initial value of -1 flags that we haven't got it set yet.
        sd->fTagsIdx = -1;
        int32_t  thisTagGroupStart = 0;   // indexes into the global rule status vals list
        int32_t  nextTagGroupStart = 0;

        // Loop runs once per group of tags in the global list
        while (nextTagGroupStart < fRB->fRuleStatusVals->size()) {
            thisTagGroupStart = nextTagGroupStart;
            nextTagGroupStart += fRB->fRuleStatusVals->elementAti(thisTagGroupStart) + 1;
            if (thisStatesTagValues->size() != fRB->fRuleStatusVals->elementAti(thisTagGroupStart)) {
                // The number of tags for this state is different from
                //    the number of tags in this group from the global list.
                //    Continue with the next group from the global list.
                continue;
            }
            // The lengths match, go ahead and compare the actual tag values
            //    between this state and the group from the global list.
            for (i=0; i<thisStatesTagValues->size(); i++) {
                if (thisStatesTagValues->elementAti(i) !=
                    fRB->fRuleStatusVals->elementAti(thisTagGroupStart + 1 + i) ) {
                    // Mismatch.
                    break;
                }
            }

            if (i == thisStatesTagValues->size()) {
                // We found a set of tag values in the global list that match
                //   those for this state.  Use them.
                sd->fTagsIdx = thisTagGroupStart;
                break;
            }
        }

        if (sd->fTagsIdx == -1) {
            // No suitable entry in the global tag list already.  Add one
            sd->fTagsIdx = fRB->fRuleStatusVals->size();
            fRB->fRuleStatusVals->addElement(thisStatesTagValues->size(), *fStatus);
            for (i=0; i<thisStatesTagValues->size(); i++) {
                fRB->fRuleStatusVals->addElement(thisStatesTagValues->elementAti(i), *fStatus);
            }
        }
    }
}